

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O3

cio_http_cb_return handle_field_name(cio_http_client *client,char *at,size_t length)

{
  cio_http_location_handler *pcVar1;
  byte bVar2;
  int iVar3;
  
  pcVar1 = client->current_handler;
  if (length == 0x16) {
    iVar3 = cio_strncasecmp(at,"Sec-WebSocket-Protocol",0x16);
    if (iVar3 != 0) {
      return CIO_HTTP_CB_SUCCESS;
    }
    *(byte *)&pcVar1[1].on_message_complete = *(byte *)&pcVar1[1].on_message_complete | 3;
    return CIO_HTTP_CB_SUCCESS;
  }
  if (length == 0x15) {
    iVar3 = cio_strncasecmp(at,"Sec-WebSocket-Version",0x15);
    if (iVar3 != 0) {
      return CIO_HTTP_CB_SUCCESS;
    }
    bVar2 = *(byte *)&pcVar1[1].on_message_complete & 0xfc | 2;
  }
  else {
    if (length != 0x11) {
      return CIO_HTTP_CB_SUCCESS;
    }
    iVar3 = cio_strncasecmp(at,"Sec-WebSocket-Key",0x11);
    if (iVar3 != 0) {
      return CIO_HTTP_CB_SUCCESS;
    }
    bVar2 = (*(byte *)&pcVar1[1].on_message_complete & 0xfc) + 1;
  }
  *(byte *)&pcVar1[1].on_message_complete = bVar2;
  return CIO_HTTP_CB_SUCCESS;
}

Assistant:

static enum cio_http_cb_return handle_field_name(struct cio_http_client *client, const char *at, size_t length)
{
	static const char SEC_KEY[] = "Sec-WebSocket-Key";
	static const char WS_VERSION[] = "Sec-WebSocket-Version";
	static const char WS_PROTOCOL[] = "Sec-WebSocket-Protocol";

	struct cio_websocket_location_handler *websocket = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);

	if ((sizeof(SEC_KEY) - 1 == length) && (cio_strncasecmp(at, SEC_KEY, length) == 0)) {
		websocket->flags.current_header_field = CIO_WS_HEADER_SEC_WEBSOCKET_KEY;
	} else if ((sizeof(WS_VERSION) - 1 == length) && (cio_strncasecmp(at, WS_VERSION, length) == 0)) {
		websocket->flags.current_header_field = CIO_WS_HEADER_SEC_WEBSOCKET_VERSION;
	} else if ((sizeof(WS_PROTOCOL) - 1 == length) && (cio_strncasecmp(at, WS_PROTOCOL, length) == 0)) {
		websocket->flags.current_header_field = CIO_WS_HEADER_SEC_WEBSOCKET_PROTOCOL;
	}

	return CIO_HTTP_CB_SUCCESS;
}